

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O2

void __thiscall iDynTree::AttitudeQuaternionEKF::AttitudeQuaternionEKF(AttitudeQuaternionEKF *this)

{
  long lVar1;
  AttitudeEstimatorState *pAVar2;
  AttitudeEstimatorState *pAVar3;
  byte bVar4;
  Matrix4x4 *local_48;
  double dStack_40;
  double local_38;
  
  bVar4 = 0;
  (this->super_IAttitudeEstimator)._vptr_IAttitudeEstimator =
       (_func_int **)&PTR__IAttitudeEstimator_0020aae0;
  DiscreteExtendedKalmanFilterHelper::DiscreteExtendedKalmanFilterHelper
            (&this->super_DiscreteExtendedKalmanFilterHelper);
  (this->super_IAttitudeEstimator)._vptr_IAttitudeEstimator =
       (_func_int **)&PTR__AttitudeQuaternionEKF_0020abf8;
  (this->super_DiscreteExtendedKalmanFilterHelper)._vptr_DiscreteExtendedKalmanFilterHelper =
       (_func_int **)&PTR_ekf_f_0020ac98;
  AttitudeQuaternionEKFParameters::AttitudeQuaternionEKFParameters(&this->m_params_qekf);
  iDynTree::Rotation::Rotation(&this->m_orientationInSO3);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_x);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_y);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_u);
  this->m_initialized = false;
  VectorFixSize<4U>::zero(&(this->m_state_qekf).m_orientation);
  (this->m_state_qekf).m_orientation.m_data[0] = 1.0;
  VectorFixSize<3U>::zero(&(this->m_state_qekf).m_angular_velocity);
  VectorFixSize<3U>::zero(&(this->m_state_qekf).m_gyroscope_bias);
  pAVar2 = &this->m_state_qekf;
  pAVar3 = &this->m_initial_state_qekf;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pAVar3->m_orientation).m_data[0] = (pAVar2->m_orientation).m_data[0];
    pAVar2 = (AttitudeEstimatorState *)((long)pAVar2 + (ulong)bVar4 * -0x10 + 8);
    pAVar3 = (AttitudeEstimatorState *)((long)pAVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  iDynTree::Rotation::fromQuaternion((VectorFixSize *)&this->m_orientationInSO3);
  iDynTree::Rotation::asRPY();
  (this->m_orientationInRPY).m_data[2] = local_38;
  (this->m_orientationInRPY).m_data[0] = (double)local_48;
  (this->m_orientationInRPY).m_data[1] = dStack_40;
  VectorFixSize<3U>::zero(&this->m_Omega_y);
  VectorFixSize<3U>::zero(&this->m_Acc_y);
  (this->m_Acc_y).m_data[2] = 1.0;
  VectorFixSize<3U>::zero(&(this->m_gravity_direction).super_Vector3);
  (this->m_gravity_direction).super_Vector3.m_data[2] = 1.0;
  local_48 = &this->m_Id4;
  Eigen::internal::
  setIdentity_impl<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>,_true>
  ::run((Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_> *)&local_48);
  (this->m_Id3).m_data[0] = 1.0;
  (this->m_Id3).m_data[3] = 0.0;
  (this->m_Id3).m_data[1] = 0.0;
  (this->m_Id3).m_data[2] = 0.0;
  (this->m_Id3).m_data[4] = 1.0;
  (this->m_Id3).m_data[5] = 0.0;
  (this->m_Id3).m_data[6] = 0.0;
  (this->m_Id3).m_data[7] = 0.0;
  (this->m_Id3).m_data[8] = 1.0;
  return;
}

Assistant:

iDynTree::AttitudeQuaternionEKF::AttitudeQuaternionEKF()
{
    m_state_qekf.m_orientation.zero();
    m_state_qekf.m_orientation(0) = 1.0;
    m_state_qekf.m_angular_velocity.zero();
    m_state_qekf.m_gyroscope_bias.zero();

    m_initial_state_qekf = m_state_qekf;
    m_orientationInSO3.fromQuaternion(m_state_qekf.m_orientation);
    m_orientationInRPY = m_orientationInSO3.asRPY();

    m_Omega_y.zero();
    m_Acc_y.zero();
    m_Acc_y(2) = 1; // TODO: validate this assumption at initial step

    m_gravity_direction.zero();
    m_gravity_direction(2) = 1;

    using iDynTree::toEigen;
    toEigen(m_Id4).setIdentity();
    toEigen(m_Id3).setIdentity();
}